

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint64_t uVar103;
  uint64_t uVar104;
  uint64_t uVar105;
  secp256k1_gej *r_00;
  uint64_t mask1;
  ulong *puVar106;
  ulong uVar107;
  long lVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  uint uVar112;
  int iVar113;
  long lVar114;
  ulong *puVar115;
  ulong uVar116;
  ulong *puVar117;
  ulong uVar118;
  secp256k1_gej *in_R8;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  byte bVar122;
  uint64_t tmp2;
  uint64_t tmp3;
  uint64_t tmp3_1;
  secp256k1_fe Z;
  secp256k1_ge pre_a_lam [8];
  secp256k1_ge pre_a [8];
  uint64_t tmp1;
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  int wnaf_1 [33];
  int wnaf_lam [33];
  secp256k1_ge local_858;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  ulong local_7f0;
  ulong local_7e8;
  uint64_t *local_7e0;
  secp256k1_fe *local_7d8;
  secp256k1_fe *local_7d0;
  secp256k1_gej *local_7c8;
  ulong local_7c0;
  secp256k1_fe local_7b0;
  secp256k1_ge local_788;
  uint64_t auStack_730 [5];
  ulong auStack_708 [72];
  secp256k1_ge local_4c8;
  uint64_t auStack_470 [5];
  ulong auStack_448 [72];
  secp256k1_gej local_208;
  secp256k1_scalar local_188;
  secp256k1_scalar local_168;
  uint local_148 [36];
  uint local_b8 [34];
  
  bVar122 = 0;
  if (size < 0x81) {
    local_7f4 = secp256k1_wnaf_const((int *)local_148,scalar,size,size);
    local_7fc = size + 3U >> 2;
    local_7f8 = 0;
  }
  else {
    iVar113 = size;
    secp256k1_scalar_split_lambda(&local_168,&local_188,scalar);
    local_7f4 = secp256k1_wnaf_const((int *)local_148,&local_168,0x80,iVar113);
    local_7f8 = secp256k1_wnaf_const((int *)local_b8,&local_188,0x80,iVar113);
    local_7fc = 0x20;
  }
  r->infinity = a->infinity;
  uVar103 = (a->x).n[1];
  uVar104 = (a->x).n[2];
  uVar105 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar103;
  (r->x).n[2] = uVar104;
  (r->x).n[3] = uVar105;
  (r->x).n[4] = (a->x).n[4];
  local_7d8 = &r->y;
  uVar103 = (a->y).n[1];
  uVar104 = (a->y).n[2];
  uVar105 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar103;
  (r->y).n[2] = uVar104;
  (r->y).n[3] = uVar105;
  (r->y).n[4] = (a->y).n[4];
  local_7d0 = &r->z;
  (r->z).n[0] = 1;
  local_7e0 = (r->z).n + 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  local_7c8 = r;
  secp256k1_ecmult_odd_multiples_table((int)&local_4c8,&local_788,&local_7b0,&r->x,in_R8);
  secp256k1_ge_table_set_globalz(8,&local_4c8,&local_788.x);
  lVar114 = 0x28;
  do {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)local_4c8.x.n + lVar114));
    r_00 = local_7c8;
    lVar114 = lVar114 + 0x58;
  } while (lVar114 != 0x2e8);
  if (0x80 < size) {
    lVar114 = 0;
    do {
      puVar106 = (ulong *)((long)local_788.x.n + lVar114);
      puVar115 = (ulong *)((long)local_4c8.x.n + lVar114);
      puVar117 = puVar106;
      for (lVar108 = 0xb; lVar108 != 0; lVar108 = lVar108 + -1) {
        *puVar117 = *puVar115;
        puVar115 = puVar115 + (ulong)bVar122 * -2 + 1;
        puVar117 = puVar117 + (ulong)bVar122 * -2 + 1;
      }
      uVar110 = *puVar106;
      uVar120 = *(ulong *)((long)local_788.x.n + lVar114 + 8);
      uVar118 = *(ulong *)((long)local_788.x.n + lVar114 + 0x10);
      uVar116 = *(ulong *)((long)local_788.x.n + lVar114 + 0x18);
      uVar111 = *(ulong *)((long)local_788.x.n + lVar114 + 0x20);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar116;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar118;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar120;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar110;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar111;
      uVar107 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar41,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar107 & 0xfffffffffffff;
      auVar2 = ZEXT816(0x7512f58995c13) * auVar38 + ZEXT816(0x96c28719501ee) * auVar37 +
               ZEXT816(0xc3434e99cf049) * auVar39 + ZEXT816(0x7106e64479ea) * auVar40 +
               auVar2 * ZEXT816(0x1000003d10);
      uVar109 = auVar2._0_8_;
      local_208.x.n[0] = uVar109 & 0xfffffffffffff;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar109 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar111;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar116;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar118;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar120;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar110;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar107 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar41,8) << 0xc;
      auVar2 = ZEXT816(0x96c28719501ee) * auVar42 + auVar89 + ZEXT816(0x7512f58995c13) * auVar43 +
               ZEXT816(0xc3434e99cf049) * auVar44 + ZEXT816(0x7106e64479ea) * auVar45 +
               ZEXT816(0x7ae96a2b657c) * auVar46 + auVar3 * ZEXT816(0x1000003d10);
      uVar107 = auVar2._0_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar107 >> 0x34 | auVar2._8_8_ << 0xc;
      local_7c0 = (uVar107 & 0xfffffffffffff) >> 0x30;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar110;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar111;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar116;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar118;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar120;
      auVar2 = ZEXT816(0x7512f58995c13) * auVar48 + auVar90 + ZEXT816(0xc3434e99cf049) * auVar49 +
               ZEXT816(0x7106e64479ea) * auVar50 + ZEXT816(0x7ae96a2b657c) * auVar51;
      uVar109 = auVar2._0_8_;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar109 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = (uVar109 & 0xfffffffffffff) << 4 | local_7c0;
      uVar109 = auVar7._0_8_;
      auVar7 = ZEXT816(0x96c28719501ee) * auVar47 + ZEXT816(0x1000003d1) * auVar52;
      *puVar106 = uVar109 & 0xfffffffffffff;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar109 >> 0x34 | auVar7._8_8_ << 0xc;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar120;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar110;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar111;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar116;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar118;
      auVar3 = ZEXT816(0xc3434e99cf049) * auVar55 + auVar92 + ZEXT816(0x7106e64479ea) * auVar56 +
               ZEXT816(0x7ae96a2b657c) * auVar57;
      uVar109 = auVar3._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar109 & 0xfffffffffffff;
      auVar2 = ZEXT816(0x96c28719501ee) * auVar53 + auVar91 + ZEXT816(0x7512f58995c13) * auVar54 +
               auVar4 * ZEXT816(0x1000003d10);
      uVar119 = auVar2._0_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar109 >> 0x34 | auVar3._8_8_ << 0xc;
      *(ulong *)((long)local_788.x.n + lVar114 + 8) = uVar119 & 0xfffffffffffff;
      uVar103 = local_208.x.n[0];
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar119 >> 0x34 | auVar2._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar118;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar120;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar110;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar111;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar116;
      auVar3 = ZEXT816(0x7106e64479ea) * auVar61 + auVar94 + ZEXT816(0x7ae96a2b657c) * auVar62;
      uVar110 = auVar3._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar110 & 0xfffffffffffff;
      auVar2 = ZEXT816(0x96c28719501ee) * auVar58 + auVar93 + ZEXT816(0x7512f58995c13) * auVar59 +
               ZEXT816(0xc3434e99cf049) * auVar60 + auVar5 * ZEXT816(0x1000003d10);
      uVar120 = auVar2._0_8_;
      *(ulong *)((long)local_788.x.n + lVar114 + 0x10) = uVar120 & 0xfffffffffffff;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = (uVar120 >> 0x34 | auVar2._8_8_ << 0xc) + uVar103;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar110 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar95 = auVar6 * ZEXT816(0x1000003d10) + auVar95;
      uVar110 = auVar95._0_8_;
      *(ulong *)((long)local_788.x.n + lVar114 + 0x18) = uVar110 & 0xfffffffffffff;
      *(ulong *)((long)local_788.x.n + lVar114 + 0x20) =
           (uVar110 >> 0x34 | auVar95._8_8_ << 0xc) + (uVar107 & 0xffffffffffff);
      lVar114 = lVar114 + 0x58;
    } while (lVar114 != 0x2c0);
  }
  local_7f0 = (ulong)local_7fc;
  uVar1 = local_148[local_7f0];
  uVar112 = -uVar1;
  if (uVar1 != uVar112 && SBORROW4(uVar1,uVar112) == (int)(uVar1 * 2) < 0) {
    uVar112 = uVar1;
  }
  lVar114 = 0;
  local_858.x.n[4] = local_4c8.x.n[4];
  local_858.x.n[0] = local_4c8.x.n[0];
  local_858.x.n[1] = local_4c8.x.n[1];
  local_858.x.n[2] = local_4c8.x.n[2];
  local_858.x.n[3] = local_4c8.x.n[3];
  uVar111 = local_4c8.y.n[4];
  uVar116 = local_4c8.y.n[3];
  uVar118 = local_4c8.y.n[2];
  uVar120 = local_4c8.y.n[1];
  uVar110 = local_4c8.y.n[0];
  do {
    if ((ulong)(uVar112 >> 1) * 0x58 + -0x58 == lVar114) {
      local_858.x.n[0] = *(uint64_t *)((long)auStack_470 + lVar114);
      local_858.x.n[1] = *(uint64_t *)((long)auStack_470 + lVar114 + 8);
      local_858.x.n[2] = *(uint64_t *)((long)auStack_470 + lVar114 + 0x10);
      local_858.x.n[3] = *(uint64_t *)((long)auStack_470 + lVar114 + 0x18);
      local_858.x.n[4] = *(uint64_t *)((long)auStack_470 + lVar114 + 0x20);
      uVar110 = *(ulong *)((long)auStack_448 + lVar114);
      uVar120 = *(ulong *)((long)auStack_448 + lVar114 + 8);
      uVar118 = *(ulong *)((long)auStack_448 + lVar114 + 0x10);
      uVar116 = *(ulong *)((long)auStack_448 + lVar114 + 0x18);
      uVar111 = *(ulong *)((long)auStack_448 + lVar114 + 0x20);
    }
    lVar114 = lVar114 + 0x58;
  } while (lVar114 != 0x268);
  uVar107 = (ulong)(uVar1 >> 0x1f) - 1;
  uVar109 = -(ulong)(uVar1 >> 0x1f);
  local_858.y.n[0] = 0x3ffffbfffff0bc - uVar110 & uVar109 | uVar110 & uVar107;
  local_858.y.n[1] = 0x3ffffffffffffc - uVar120 & uVar109 | uVar120 & uVar107;
  local_858.y.n[2] = 0x3ffffffffffffc - uVar118 & uVar109 | uVar118 & uVar107;
  local_858.y.n[3] = 0x3ffffffffffffc - uVar116 & uVar109 | uVar116 & uVar107;
  local_858.y.n[4] = uVar109 & 0x3fffffffffffc - uVar111 | uVar111 & uVar107;
  local_858.infinity = 0;
  local_7c8->infinity = 0;
  (local_7c8->x).n[4] = local_858.x.n[4];
  (local_7c8->x).n[2] = local_858.x.n[2];
  (local_7c8->x).n[3] = local_858.x.n[3];
  (local_7c8->x).n[0] = local_858.x.n[0];
  (local_7c8->x).n[1] = local_858.x.n[1];
  local_7d8->n[2] = local_858.y.n[2];
  local_7d8->n[3] = local_858.y.n[3];
  local_7d8->n[4] = local_858.y.n[4];
  local_7d8->n[0] = local_858.y.n[0];
  local_7d8->n[1] = local_858.y.n[1];
  (local_7c8->z).n[0] = 1;
  local_7e0[2] = 0;
  local_7e0[3] = 0;
  *local_7e0 = 0;
  local_7e0[1] = 0;
  local_7e8 = (ulong)(uint)size;
  if (0x80 < size) {
    uVar1 = local_b8[local_7f0];
    uVar112 = -uVar1;
    if (uVar1 != uVar112 && SBORROW4(uVar1,uVar112) == (int)(uVar1 * 2) < 0) {
      uVar112 = uVar1;
    }
    lVar114 = 0;
    local_858.x.n[4] = local_788.x.n[4];
    uVar111 = local_788.y.n[4];
    uVar116 = local_788.y.n[3];
    uVar118 = local_788.y.n[2];
    uVar120 = local_788.y.n[1];
    uVar110 = local_788.y.n[0];
    local_858.x.n[0] = local_788.x.n[0];
    local_858.x.n[1] = local_788.x.n[1];
    local_858.x.n[2] = local_788.x.n[2];
    local_858.x.n[3] = local_788.x.n[3];
    do {
      if ((ulong)(uVar112 >> 1) * 0x58 + -0x58 == lVar114) {
        local_858.x.n[0] = *(uint64_t *)((long)auStack_730 + lVar114);
        local_858.x.n[1] = *(uint64_t *)((long)auStack_730 + lVar114 + 8);
        local_858.x.n[2] = *(uint64_t *)((long)auStack_730 + lVar114 + 0x10);
        local_858.x.n[3] = *(uint64_t *)((long)auStack_730 + lVar114 + 0x18);
        local_858.x.n[4] = *(uint64_t *)((long)auStack_730 + lVar114 + 0x20);
        uVar110 = *(ulong *)((long)auStack_708 + lVar114);
        uVar120 = *(ulong *)((long)auStack_708 + lVar114 + 8);
        uVar118 = *(ulong *)((long)auStack_708 + lVar114 + 0x10);
        uVar116 = *(ulong *)((long)auStack_708 + lVar114 + 0x18);
        uVar111 = *(ulong *)((long)auStack_708 + lVar114 + 0x20);
      }
      lVar114 = lVar114 + 0x58;
    } while (lVar114 != 0x268);
    uVar107 = (ulong)(uVar1 >> 0x1f) - 1;
    uVar109 = -(ulong)(uVar1 >> 0x1f);
    local_858.y.n[0] = 0x3ffffbfffff0bc - uVar110 & uVar109 | uVar110 & uVar107;
    local_858.infinity = 0;
    local_858.y.n[1] = 0x3ffffffffffffc - uVar120 & uVar109 | uVar120 & uVar107;
    local_858.y.n[2] = 0x3ffffffffffffc - uVar118 & uVar109 | uVar118 & uVar107;
    local_858.y.n[3] = 0x3ffffffffffffc - uVar116 & uVar109 | uVar116 & uVar107;
    local_858.y.n[4] = uVar109 & 0x3fffffffffffc - uVar111 | uVar111 & uVar107;
    secp256k1_gej_add_ge(local_7c8,local_7c8,&local_858);
  }
  if (local_7fc != 0) {
    do {
      uVar110 = local_7f0;
      iVar113 = 4;
      do {
        secp256k1_gej_double(r_00,r_00);
        iVar113 = iVar113 + -1;
      } while (iVar113 != 0);
      local_7f0 = uVar110 - 1;
      uVar1 = local_148[uVar110 - 1];
      uVar112 = -uVar1;
      if (uVar1 != uVar112 && SBORROW4(uVar1,uVar112) == (int)(uVar1 * 2) < 0) {
        uVar112 = uVar1;
      }
      lVar114 = 0;
      uVar107 = local_4c8.y.n[4];
      uVar111 = local_4c8.y.n[3];
      local_858.x.n[4] = local_4c8.x.n[4];
      uVar116 = local_4c8.y.n[2];
      uVar118 = local_4c8.y.n[1];
      uVar120 = local_4c8.y.n[0];
      local_858.x.n[0] = local_4c8.x.n[0];
      local_858.x.n[1] = local_4c8.x.n[1];
      local_858.x.n[2] = local_4c8.x.n[2];
      local_858.x.n[3] = local_4c8.x.n[3];
      do {
        if ((ulong)(uVar112 >> 1) * 0x58 + -0x58 == lVar114) {
          local_858.x.n[0] = *(uint64_t *)((long)auStack_470 + lVar114);
          local_858.x.n[1] = *(uint64_t *)((long)auStack_470 + lVar114 + 8);
          local_858.x.n[2] = *(uint64_t *)((long)auStack_470 + lVar114 + 0x10);
          local_858.x.n[3] = *(uint64_t *)((long)auStack_470 + lVar114 + 0x18);
          local_858.x.n[4] = *(uint64_t *)((long)auStack_470 + lVar114 + 0x20);
          uVar120 = *(ulong *)((long)auStack_448 + lVar114);
          uVar118 = *(ulong *)((long)auStack_448 + lVar114 + 8);
          uVar116 = *(ulong *)((long)auStack_448 + lVar114 + 0x10);
          uVar111 = *(ulong *)((long)auStack_448 + lVar114 + 0x18);
          uVar107 = *(ulong *)((long)auStack_448 + lVar114 + 0x20);
        }
        lVar114 = lVar114 + 0x58;
      } while (lVar114 != 0x268);
      local_858.infinity = 0;
      uVar109 = (ulong)(uVar1 >> 0x1f) - 1;
      uVar119 = -(ulong)(uVar1 >> 0x1f);
      local_858.y.n[0] = 0x3ffffbfffff0bc - uVar120 & uVar119 | uVar120 & uVar109;
      local_858.y.n[1] = 0x3ffffffffffffc - uVar118 & uVar119 | uVar118 & uVar109;
      local_858.y.n[2] = 0x3ffffffffffffc - uVar116 & uVar119 | uVar116 & uVar109;
      local_858.y.n[3] = 0x3ffffffffffffc - uVar111 & uVar119 | uVar111 & uVar109;
      local_858.y.n[4] = uVar119 & 0x3fffffffffffc - uVar107 | uVar107 & uVar109;
      secp256k1_gej_add_ge(r_00,r_00,&local_858);
      if (0x80 < (int)local_7e8) {
        uVar1 = local_b8[local_7f0];
        uVar112 = -uVar1;
        if (uVar1 != uVar112 && SBORROW4(uVar1,uVar112) == (int)(uVar1 * 2) < 0) {
          uVar112 = uVar1;
        }
        lVar114 = 0;
        uVar107 = local_788.y.n[4];
        uVar111 = local_788.y.n[3];
        local_858.x.n[4] = local_788.x.n[4];
        uVar116 = local_788.y.n[2];
        uVar118 = local_788.y.n[1];
        uVar120 = local_788.y.n[0];
        local_858.x.n[0] = local_788.x.n[0];
        local_858.x.n[1] = local_788.x.n[1];
        local_858.x.n[2] = local_788.x.n[2];
        local_858.x.n[3] = local_788.x.n[3];
        do {
          if ((ulong)(uVar112 >> 1) * 0x58 + -0x58 == lVar114) {
            local_858.x.n[0] = *(uint64_t *)((long)auStack_730 + lVar114);
            local_858.x.n[1] = *(uint64_t *)((long)auStack_730 + lVar114 + 8);
            local_858.x.n[2] = *(uint64_t *)((long)auStack_730 + lVar114 + 0x10);
            local_858.x.n[3] = *(uint64_t *)((long)auStack_730 + lVar114 + 0x18);
            local_858.x.n[4] = *(uint64_t *)((long)auStack_730 + lVar114 + 0x20);
            uVar120 = *(ulong *)((long)auStack_708 + lVar114);
            uVar118 = *(ulong *)((long)auStack_708 + lVar114 + 8);
            uVar116 = *(ulong *)((long)auStack_708 + lVar114 + 0x10);
            uVar111 = *(ulong *)((long)auStack_708 + lVar114 + 0x18);
            uVar107 = *(ulong *)((long)auStack_708 + lVar114 + 0x20);
          }
          lVar114 = lVar114 + 0x58;
        } while (lVar114 != 0x268);
        local_858.infinity = 0;
        uVar109 = (ulong)(uVar1 >> 0x1f) - 1;
        uVar119 = -(ulong)(uVar1 >> 0x1f);
        local_858.y.n[0] = 0x3ffffbfffff0bc - uVar120 & uVar119 | uVar120 & uVar109;
        local_858.y.n[1] = 0x3ffffffffffffc - uVar118 & uVar119 | uVar118 & uVar109;
        local_858.y.n[2] = 0x3ffffffffffffc - uVar116 & uVar119 | uVar116 & uVar109;
        local_858.y.n[3] = 0x3ffffffffffffc - uVar111 & uVar119 | uVar111 & uVar109;
        local_858.y.n[4] = uVar119 & 0x3fffffffffffc - uVar107 | uVar107 & uVar109;
        secp256k1_gej_add_ge(r_00,r_00,&local_858);
      }
    } while (1 < (long)uVar110);
  }
  secp256k1_ge_neg(&local_858,&local_4c8);
  secp256k1_gej_add_ge(&local_208,r_00,&local_858);
  uVar110 = (ulong)local_7f4 - 1;
  uVar120 = -(ulong)local_7f4;
  (r_00->x).n[0] = local_208.x.n[0] & uVar120 | (r_00->x).n[0] & uVar110;
  (r_00->x).n[1] = local_208.x.n[1] & uVar120 | (r_00->x).n[1] & uVar110;
  (r_00->x).n[2] = local_208.x.n[2] & uVar120 | (r_00->x).n[2] & uVar110;
  (r_00->x).n[3] = local_208.x.n[3] & uVar120 | (r_00->x).n[3] & uVar110;
  (r_00->x).n[4] = local_208.x.n[4] & uVar120 | (r_00->x).n[4] & uVar110;
  (r_00->y).n[0] = local_208.y.n[0] & uVar120 | (r_00->y).n[0] & uVar110;
  (r_00->y).n[1] = local_208.y.n[1] & uVar120 | (r_00->y).n[1] & uVar110;
  (r_00->y).n[2] = local_208.y.n[2] & uVar120 | (r_00->y).n[2] & uVar110;
  (r_00->y).n[3] = local_208.y.n[3] & uVar120 | (r_00->y).n[3] & uVar110;
  (r_00->y).n[4] = local_208.y.n[4] & uVar120 | (r_00->y).n[4] & uVar110;
  (r_00->z).n[0] = local_208.z.n[0] & uVar120 | (r_00->z).n[0] & uVar110;
  (r_00->z).n[1] = local_208.z.n[1] & uVar120 | (r_00->z).n[1] & uVar110;
  (r_00->z).n[2] = local_208.z.n[2] & uVar120 | (r_00->z).n[2] & uVar110;
  (r_00->z).n[3] = local_208.z.n[3] & uVar120 | (r_00->z).n[3] & uVar110;
  (r_00->z).n[4] = uVar120 & local_208.z.n[4] | uVar110 & (r_00->z).n[4];
  r_00->infinity = (local_208.infinity ^ r_00->infinity) & local_7f4 ^ r_00->infinity;
  if (0x80 < (int)local_7e8) {
    secp256k1_ge_neg(&local_858,&local_788);
    secp256k1_gej_add_ge(&local_208,r_00,&local_858);
    uVar110 = (ulong)local_7f8 - 1;
    uVar120 = -(ulong)local_7f8;
    (r_00->x).n[0] = local_208.x.n[0] & uVar120 | (r_00->x).n[0] & uVar110;
    (r_00->x).n[1] = local_208.x.n[1] & uVar120 | (r_00->x).n[1] & uVar110;
    (r_00->x).n[2] = local_208.x.n[2] & uVar120 | (r_00->x).n[2] & uVar110;
    (r_00->x).n[3] = local_208.x.n[3] & uVar120 | (r_00->x).n[3] & uVar110;
    (r_00->x).n[4] = local_208.x.n[4] & uVar120 | (r_00->x).n[4] & uVar110;
    (r_00->y).n[0] = local_208.y.n[0] & uVar120 | (r_00->y).n[0] & uVar110;
    (r_00->y).n[1] = local_208.y.n[1] & uVar120 | (r_00->y).n[1] & uVar110;
    (r_00->y).n[2] = local_208.y.n[2] & uVar120 | (r_00->y).n[2] & uVar110;
    (r_00->y).n[3] = local_208.y.n[3] & uVar120 | (r_00->y).n[3] & uVar110;
    (r_00->y).n[4] = local_208.y.n[4] & uVar120 | (r_00->y).n[4] & uVar110;
    (r_00->z).n[0] = local_208.z.n[0] & uVar120 | (r_00->z).n[0] & uVar110;
    (r_00->z).n[1] = local_208.z.n[1] & uVar120 | (r_00->z).n[1] & uVar110;
    (r_00->z).n[2] = local_208.z.n[2] & uVar120 | (r_00->z).n[2] & uVar110;
    (r_00->z).n[3] = local_208.z.n[3] & uVar120 | (r_00->z).n[3] & uVar110;
    (r_00->z).n[4] = uVar120 & local_208.z.n[4] | uVar110 & (r_00->z).n[4];
    r_00->infinity = (local_208.infinity ^ r_00->infinity) & local_7f8 ^ r_00->infinity;
  }
  uVar110 = local_7d0->n[0];
  uVar120 = local_7d0->n[1];
  uVar118 = local_7d0->n[2];
  uVar116 = local_7d0->n[3];
  uVar111 = local_7d0->n[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_7b0.n[0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar116;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_7b0.n[1];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar118;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_7b0.n[2];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar120;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_7b0.n[3];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar110;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_7b0.n[4];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar111;
  uVar107 = SUB168(auVar11 * auVar67,0);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar107 & 0xfffffffffffff;
  auVar7 = auVar8 * auVar64 + auVar7 * auVar63 + auVar9 * auVar65 + auVar10 * auVar66 +
           auVar12 * ZEXT816(0x1000003d10);
  uVar109 = auVar7._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar109 >> 0x34 | auVar7._8_8_ << 0xc;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_7b0.n[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar111;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_7b0.n[1];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar116;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_7b0.n[2];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar118;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_7b0.n[3];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar120;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_7b0.n[4];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar110;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar107 >> 0x34 | SUB168(auVar11 * auVar67,8) << 0xc;
  auVar7 = auVar13 * auVar68 + auVar96 + auVar14 * auVar69 + auVar15 * auVar70 + auVar16 * auVar71 +
           auVar17 * auVar72 + auVar18 * ZEXT816(0x1000003d10);
  uVar107 = auVar7._0_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar107 >> 0x34 | auVar7._8_8_ << 0xc;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_7b0.n[0];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar110;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_7b0.n[1];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar111;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_7b0.n[2];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar116;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_7b0.n[3];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar118;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_7b0.n[4];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar120;
  auVar7 = auVar20 * auVar74 + auVar97 + auVar21 * auVar75 + auVar22 * auVar76 + auVar23 * auVar77;
  uVar119 = auVar7._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar119 >> 0x34 | auVar7._8_8_ << 0xc;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = (uVar119 & 0xfffffffffffff) << 4 | (uVar107 & 0xfffffffffffff) >> 0x30;
  auVar7 = auVar19 * auVar73 + ZEXT816(0x1000003d1) * auVar78;
  uVar119 = auVar7._0_8_;
  local_7d0->n[0] = uVar119 & 0xfffffffffffff;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar119 >> 0x34 | auVar7._8_8_ << 0xc;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_7b0.n[0];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar120;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_7b0.n[1];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar110;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_7b0.n[2];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar111;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_7b0.n[3];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar116;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_7b0.n[4];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar118;
  auVar2 = auVar26 * auVar81 + auVar99 + auVar27 * auVar82 + auVar28 * auVar83;
  uVar119 = auVar2._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar119 & 0xfffffffffffff;
  auVar7 = auVar24 * auVar79 + auVar98 + auVar25 * auVar80 + auVar29 * ZEXT816(0x1000003d10);
  uVar121 = auVar7._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar119 >> 0x34 | auVar2._8_8_ << 0xc;
  local_7d0->n[1] = uVar121 & 0xfffffffffffff;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar121 >> 0x34 | auVar7._8_8_ << 0xc;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_7b0.n[0];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar118;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_7b0.n[1];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar120;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_7b0.n[2];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar110;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_7b0.n[3];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar111;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_7b0.n[4];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar116;
  auVar2 = auVar33 * auVar87 + auVar101 + auVar34 * auVar88;
  uVar110 = auVar2._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar110 & 0xfffffffffffff;
  auVar7 = auVar30 * auVar84 + auVar100 + auVar31 * auVar85 + auVar32 * auVar86 +
           auVar35 * ZEXT816(0x1000003d10);
  uVar120 = auVar7._0_8_;
  local_7d0->n[2] = uVar120 & 0xfffffffffffff;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = (uVar120 >> 0x34 | auVar7._8_8_ << 0xc) + (uVar109 & 0xfffffffffffff);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar110 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar102 = auVar36 * ZEXT816(0x1000003d10) + auVar102;
  uVar110 = auVar102._0_8_;
  local_7d0->n[3] = uVar110 & 0xfffffffffffff;
  local_7d0->n[4] = (uVar110 >> 0x34 | auVar102._8_8_ << 0xc) + (uVar107 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    /* build wnaf representation for q. */
    int rsize = size;
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);
    } else
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, scalar, WINDOW_A - 1, size);
        skew_lam = 0;
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }

    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        if (size > 128) {
            secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
            secp256k1_gej_add_ge(&tmpj, r, &tmpa);
            secp256k1_gej_cmov(r, &tmpj, skew_lam);
        }
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}